

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter3.cpp
# Opt level: O0

void __thiscall ApplicationContext::~ApplicationContext(ApplicationContext *this)

{
  undefined8 *in_RDI;
  CSP *in_stack_ffffffffffffffe0;
  ApplicationContextBase *this_00;
  vector<float,_std::allocator<float>_> *this_01;
  
  *in_RDI = &PTR__ApplicationContext_00259768;
  *(undefined1 *)(in_RDI + 3) = 1;
  this_01 = (vector<float,_std::allocator<float>_> *)in_RDI[0xd];
  if (this_01 != (vector<float,_std::allocator<float>_> *)0x0) {
    CSP::~CSP(in_stack_ffffffffffffffe0);
    operator_delete(this_01,0x2f0);
  }
  this_00 = (ApplicationContextBase *)in_RDI[0xe];
  if (this_00 != (ApplicationContextBase *)0x0) {
    Blackboard::~Blackboard((Blackboard *)0x12abcb);
    operator_delete(this_00,0x60);
  }
  Journal::~Journal((Journal *)0x12abe8);
  std::vector<float,_std::allocator<float>_>::~vector(this_01);
  RenderContext::~RenderContext((RenderContext *)(in_RDI + 8));
  StateContext::~StateContext((StateContext *)(in_RDI + 7));
  ApplicationContextBase::~ApplicationContextBase(this_00);
  return;
}

Assistant:

~ApplicationContext()
    {
        ///>
        /// join_now is most likely true from having been set by a Quit
        /// event, but just to be sure, set it here.
        ///<C++
        join_now = true;

        delete csp;
        delete blackboard;
    }